

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O3

void google::protobuf::json_internal::ParseProto3Type::
     SetInt<int,(google::protobuf::Field_Kind)5,(google::protobuf::Field_Kind)15,(google::protobuf::Field_Kind)17>
               (Field f,Msg *msg,int x)

{
  int iVar1;
  Field *pFVar2;
  bool bVar3;
  byte *pbVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  RecordAsSeen(f,msg);
  pFVar2 = f->raw_;
  iVar1 = (pFVar2->field_0)._impl_.kind_;
  if (iVar1 != 5) {
    if (iVar1 == 0xf) {
      iVar1 = (pFVar2->field_0)._impl_.number_;
      pbVar4 = (msg->stream_).cur_;
      if ((msg->stream_).impl_.end_ <= pbVar4) {
        pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback((EpsCopyOutputStream *)msg,pbVar4);
      }
      uVar5 = (ulong)(iVar1 * 8 + 5);
      if (0x7f < (uint)(iVar1 << 3)) {
        do {
          uVar6 = (uint)uVar5;
          *pbVar4 = (byte)uVar5 | 0x80;
          uVar5 = uVar5 >> 7;
          pbVar4 = pbVar4 + 1;
        } while (0x3fff < uVar6);
      }
      *pbVar4 = (byte)uVar5;
      pbVar4 = pbVar4 + 1;
      (msg->stream_).cur_ = pbVar4;
      if ((msg->stream_).impl_.end_ <= pbVar4) {
        pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback((EpsCopyOutputStream *)msg,pbVar4);
      }
      *(int *)pbVar4 = x;
      pbVar4 = pbVar4 + 4;
      goto LAB_002c91e6;
    }
    if (iVar1 != 0x11) {
      return;
    }
    x = x >> 0x1f ^ x * 2;
  }
  uVar6 = (pFVar2->field_0)._impl_.number_ << 3;
  pbVar4 = (msg->stream_).cur_;
  if ((msg->stream_).impl_.end_ <= pbVar4) {
    pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback((EpsCopyOutputStream *)msg,pbVar4);
  }
  uVar7 = uVar6;
  if (0x7f < uVar6) {
    do {
      *pbVar4 = (byte)uVar7 | 0x80;
      uVar6 = uVar7 >> 7;
      pbVar4 = pbVar4 + 1;
      bVar3 = 0x3fff < uVar7;
      uVar7 = uVar6;
    } while (bVar3);
  }
  *pbVar4 = (byte)uVar6;
  pbVar4 = pbVar4 + 1;
  (msg->stream_).cur_ = pbVar4;
  if ((msg->stream_).impl_.end_ <= pbVar4) {
    pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback((EpsCopyOutputStream *)msg,pbVar4);
  }
  if ((uint)x < 0x80) {
    uVar5 = (ulong)(uint)x;
  }
  else {
    uVar5 = (ulong)(uint)x;
    do {
      *pbVar4 = (byte)x | 0x80;
      uVar5 = uVar5 >> 7;
      pbVar4 = pbVar4 + 1;
      bVar3 = 0x3fff < (uint)x;
      x = (uint)uVar5;
    } while (bVar3);
  }
  *pbVar4 = (byte)uVar5;
  pbVar4 = pbVar4 + 1;
LAB_002c91e6:
  (msg->stream_).cur_ = pbVar4;
  return;
}

Assistant:

static void SetInt(Field f, Msg& msg, Int x) {
    RecordAsSeen(f, msg);
    switch (f->proto().kind()) {
      case zigzag:
        // Regardless of the integer type, ZigZag64 will do the right thing,
        // because ZigZag is not dependent on the width of the integer: it is
        // always `2 * abs(n) + (n < 0)`.
        x = static_cast<Int>(
            internal::WireFormatLite::ZigZagEncode64(static_cast<int64_t>(x)));
        ABSL_FALLTHROUGH_INTENDED;
      case varint:
        msg.stream_.WriteTag(f->proto().number() << 3 |
                             WireFormatLite::WIRETYPE_VARINT);
        if (sizeof(Int) == 4) {
          msg.stream_.WriteVarint32(static_cast<uint32_t>(x));
        } else {
          msg.stream_.WriteVarint64(static_cast<uint64_t>(x));
        }
        break;
      case fixed: {
        if (sizeof(Int) == 4) {
          msg.stream_.WriteTag(f->proto().number() << 3 |
                               WireFormatLite::WIRETYPE_FIXED32);
          msg.stream_.WriteLittleEndian32(static_cast<uint32_t>(x));
        } else {
          msg.stream_.WriteTag(f->proto().number() << 3 |
                               WireFormatLite::WIRETYPE_FIXED64);
          msg.stream_.WriteLittleEndian64(static_cast<uint64_t>(x));
        }
        break;
      }
      default: {  // Unreachable.
      }
    }
  }